

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::ValidationState_t::RegisterFunction
          (ValidationState_t *this,uint32_t id,uint32_t ret_type_id,
          FunctionControlMask function_control,uint32_t function_type_id)

{
  uint32_t local_20;
  uint32_t local_1c;
  FunctionControlMask local_18;
  uint32_t local_14;
  pointer local_10;
  
  local_20 = id;
  local_1c = function_type_id;
  local_18 = function_control;
  local_14 = ret_type_id;
  if (this->in_function_ == true) {
    __assert_fail("in_function_body() == false && \"RegisterFunction can only be called when parsing the binary outside \" \"of another function\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x1f9,
                  "spv_result_t spvtools::val::ValidationState_t::RegisterFunction(uint32_t, uint32_t, spv::FunctionControlMask, uint32_t)"
                 );
  }
  this->in_function_ = true;
  std::vector<spvtools::val::Function,std::allocator<spvtools::val::Function>>::
  emplace_back<unsigned_int&,unsigned_int&,spv::FunctionControlMask&,unsigned_int&>
            ((vector<spvtools::val::Function,std::allocator<spvtools::val::Function>> *)
             &this->module_functions_,&local_20,&local_14,&local_18,&local_1c);
  if (this->in_function_ != false) {
    local_10 = (this->module_functions_).
               super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Function*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,spvtools::val::Function*>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Function*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->id_to_function_,&local_20);
    return SPV_SUCCESS;
  }
  __assert_fail("in_function_body()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x14d,"Function &spvtools::val::ValidationState_t::current_function()");
}

Assistant:

spv_result_t ValidationState_t::RegisterFunction(
    uint32_t id, uint32_t ret_type_id,
    spv::FunctionControlMask function_control, uint32_t function_type_id) {
  assert(in_function_body() == false &&
         "RegisterFunction can only be called when parsing the binary outside "
         "of another function");
  in_function_ = true;
  module_functions_.emplace_back(id, ret_type_id, function_control,
                                 function_type_id);
  id_to_function_.emplace(id, &current_function());

  // TODO(umar): validate function type and type_id

  return SPV_SUCCESS;
}